

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O2

void __thiscall
ConfidentialTransactionContext_SetAssetIssuanceTest2_Test::TestBody
          (ConfidentialTransactionContext_SetAssetIssuanceTest2_Test *this)

{
  _func_int **lhs;
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  Amount asset_amount;
  IssuanceParameter local_bc8;
  ByteData256 contract_hash;
  Amount token_amount;
  Txid txid;
  IssuanceParameter param;
  ConfidentialTransactionContext tx;
  IssuanceOutputParameter issue_output;
  ConfidentialTransactionContext expect_tx;
  ConfidentialTransactionContext tx_base;
  IssuanceOutputParameter token_output;
  Address asset_address;
  
  std::__cxx11::string::string
            ((string *)&issue_output,
             "020000000001fa8f7f752deb920f5d94331e880c2f514016c58663496ff33cc9c2368adec3880000000000ffffffff020151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef01000000003b9328e00017a9149d4a252d04e5072497ef2ac59574b1b14a7831b18701f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000"
             ,(allocator *)&token_output);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            (&tx_base,(string *)&issue_output);
  std::__cxx11::string::~string((string *)&issue_output);
  std::__cxx11::string::string
            ((string *)&issue_output,
             "020000000001fa8f7f752deb920f5d94331e880c2f514016c58663496ff33cc9c2368adec3880000008000ffffffff0000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000001000000001dcd6500010000000000000000030151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef01000000003b9328e00017a9149d4a252d04e5072497ef2ac59574b1b14a7831b18701f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a1200000019768c01041eb448973f1870c4d9cef5f2b3d883b5844ee3579bb8e52771bcbf301000000001dcd6500001976a9148bba9241b14f785130e7ff186901997a5a1cc65688ac00000000"
             ,(allocator *)&token_output);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            (&expect_tx,(string *)&issue_output);
  std::__cxx11::string::~string((string *)&issue_output);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&tx,&tx_base);
  std::__cxx11::string::string
            ((string *)&issue_output,
             "88c3de8a36c2c93cf36f496386c51640512f0c881e33945d0f92eb2d757f8ffa",
             (allocator *)&token_output);
  cfd::core::Txid::Txid(&txid,(string *)&issue_output);
  std::__cxx11::string::~string((string *)&issue_output);
  cfd::core::Amount::Amount(&asset_amount,500000000);
  cfd::core::Amount::Amount(&token_amount);
  std::__cxx11::string::string
            ((string *)&issue_output,"2dnAZpPK76YhzKRcqMv4iBkLcMF4gP6aJ32",(allocator *)&param);
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address
            (&asset_address,(string *)&issue_output,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &token_output);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &token_output);
  std::__cxx11::string::~string((string *)&issue_output);
  cfd::core::ByteData256::ByteData256(&contract_hash);
  cfd::core::IssuanceParameter::IssuanceParameter(&param);
  cfd::IssuanceOutputParameter::IssuanceOutputParameter(&issue_output);
  cfd::IssuanceOutputParameter::IssuanceOutputParameter(&token_output);
  cfd::core::Address::operator=(&issue_output.address,&asset_address);
  issue_output.amount.ignore_check_ = asset_amount.ignore_check_;
  issue_output.amount.amount_ = asset_amount.amount_;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint((OutPoint *)&gtest_ar_1,&txid,0);
      cfd::ConfidentialTransactionContext::SetAssetIssuance
                (&local_bc8,&tx,(OutPoint *)&gtest_ar_1,&asset_amount,&issue_output,&token_amount,
                 &token_output,false,&contract_hash);
      cfd::core::IssuanceParameter::operator=(&param,&local_bc8);
      cfd::core::IssuanceParameter::~IssuanceParameter(&local_bc8);
      cfd::core::Txid::~Txid((Txid *)&gtest_ar_1);
    }
  }
  else {
    testing::Message::Message((Message *)&local_bc8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0xca,
               "Expected: (param = tx.SetAssetIssuance(OutPoint(txid, 0), asset_amount, issue_output, token_amount, token_output, is_blind, contract_hash)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_bc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_bc8);
  }
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_((string *)&local_bc8,(AbstractTransaction *)&tx)
  ;
  lhs = local_bc8.entropy._vptr_BlindFactor;
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)&gtest_ar_1,(AbstractTransaction *)&expect_tx);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"tx.GetHex().c_str()","expect_tx.GetHex().c_str()",(char *)lhs,
             (char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&local_bc8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_bc8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0xcb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_bc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_bc8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)&local_bc8,&param.entropy);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_1,"param.entropy.GetHex().c_str()",
             "\"c933a36fc6fbc1ccc50a8c73dbb7711b9958f3b1367c94ac3d3cae495aaf311f\"",
             (char *)local_bc8.entropy._vptr_BlindFactor,
             "c933a36fc6fbc1ccc50a8c73dbb7711b9958f3b1367c94ac3d3cae495aaf311f");
  std::__cxx11::string::~string((string *)&local_bc8);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_bc8);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0xce,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_bc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_bc8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::IssuanceOutputParameter::~IssuanceOutputParameter(&token_output);
  cfd::IssuanceOutputParameter::~IssuanceOutputParameter(&issue_output);
  cfd::core::IssuanceParameter::~IssuanceParameter(&param);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&contract_hash);
  cfd::core::Address::~Address(&asset_address);
  cfd::core::Txid::~Txid(&txid);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&tx);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&expect_tx);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&tx_base);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, SetAssetIssuanceTest2)
{
    // not token
    ConfidentialTransactionContext tx_base(
        "020000000001fa8f7f752deb920f5d94331e880c2f514016c58663496ff33cc9c2368adec3880000000000ffffffff020151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef01000000003b9328e00017a9149d4a252d04e5072497ef2ac59574b1b14a7831b18701f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000");
    ConfidentialTransactionContext expect_tx(
        "020000000001fa8f7f752deb920f5d94331e880c2f514016c58663496ff33cc9c2368adec3880000008000ffffffff0000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000001000000001dcd6500010000000000000000030151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef01000000003b9328e00017a9149d4a252d04e5072497ef2ac59574b1b14a7831b18701f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a1200000019768c01041eb448973f1870c4d9cef5f2b3d883b5844ee3579bb8e52771bcbf301000000001dcd6500001976a9148bba9241b14f785130e7ff186901997a5a1cc65688ac00000000");

    // not blind
    ConfidentialTransactionContext tx(tx_base);
    Txid txid("88c3de8a36c2c93cf36f496386c51640512f0c881e33945d0f92eb2d757f8ffa");
    Amount asset_amount = Amount(500000000);
    Amount token_amount;
    Address asset_address("2dnAZpPK76YhzKRcqMv4iBkLcMF4gP6aJ32", cfd::core::GetElementsAddressFormatList());
    ByteData256 contract_hash;
    bool is_blind = false;
    IssuanceParameter param;
    IssuanceOutputParameter issue_output;
    IssuanceOutputParameter token_output;
    issue_output.address = asset_address;
    issue_output.amount = asset_amount;
    EXPECT_NO_THROW(
        (param = tx.SetAssetIssuance(OutPoint(txid, 0), asset_amount,
                                     issue_output, token_amount,
                                     token_output, is_blind,
                                     contract_hash)));
    EXPECT_STREQ(tx.GetHex().c_str(), expect_tx.GetHex().c_str());
    EXPECT_STREQ(
        param.entropy.GetHex().c_str(),
        "c933a36fc6fbc1ccc50a8c73dbb7711b9958f3b1367c94ac3d3cae495aaf311f");
}